

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O2

string * __thiscall
ADSBBase::FetchMsg_abi_cxx11_(string *__return_storage_ptr__,ADSBBase *this,char *buf)

{
  JSON_Object *object;
  char *pcVar1;
  JSONRootPtr pRoot;
  string s;
  allocator<char> local_41;
  unique_ptr<json_value_t,_void_(*)(json_value_t_*)> local_40;
  string local_30 [8];
  long local_28;
  
  local_40._M_t.super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
  super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl = json_parse_string((char *)0x13b172);
  local_40._M_t.super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
  super__Tuple_impl<1UL,_void_(*)(json_value_t_*)>.
  super__Head_base<1UL,_void_(*)(json_value_t_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(json_value_t_*),_false>)json_value_free;
  if (local_40._M_t.super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
      super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
      super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl != (JSON_Value *)0x0) {
    object = json_object(local_40._M_t.super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>
                         ._M_t.super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
                         super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl);
    if (object != (JSON_Object *)0x0) {
      pcVar1 = jog_s(object,"message");
      std::__cxx11::string::string<std::allocator<char>>(local_30,pcVar1,&local_41);
      if (local_28 == 0) {
        pcVar1 = jog_s(object,"msg");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar1,&local_41);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,local_30);
      }
      std::__cxx11::string::~string(local_30);
      goto LAB_0013b20b;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0013b20b:
  std::unique_ptr<json_value_t,_void_(*)(json_value_t_*)>::~unique_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ADSBBase::FetchMsg (const char* buf)
{
    // try to interpret it as JSON, then fetch 'msg' field content
    JSONRootPtr pRoot (buf);
    if (!pRoot) return std::string();
    const JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) return std::string();
    const std::string s = jog_s(pObj, ADSBEX_MESSAGE);  // try 'message' first
    if (!s.empty())
        return s;
    else
        return jog_s(pObj, ADSBEX_MSG);                 // else try 'msg' as per documentation
}